

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::SearchComponent(BoardView *this)

{
  char (*item) [128];
  Searcher *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ImGuiIO *pIVar9;
  uint uVar10;
  ulong uVar11;
  char (*pacVar12) [128];
  bool dummy;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  results;
  string ui_number;
  string searchLabel;
  string title;
  byte local_132;
  bool local_131;
  undefined1 local_130 [24];
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_118;
  char (*local_100) [128];
  ulong local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  char (*local_d0) [128];
  char (*local_c8) [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  local_60;
  
  local_131 = true;
  pIVar9 = ImGui::GetIO();
  local_f8 = CONCAT44(local_f8._4_4_,(pIVar9->DisplaySize).x * 0.5);
  iVar7 = DPI(100);
  local_130._4_4_ = (float)iVar7;
  local_130._0_4_ = (float)local_f8;
  local_f0._M_dataplus._M_p = (pointer)0x3f000000;
  ImGui::SetNextWindowPos((ImVec2 *)local_130,0,(ImVec2 *)&local_f0);
  ImGui::PushStyleVar(4,1.0);
  bVar2 = ImGui::BeginPopupModal("Search for Component / Network",&local_131,0x160);
  if (!bVar2) goto LAB_00116380;
  bVar2 = this->m_showSearch;
  if (bVar2 == true) {
    this->m_showSearch = false;
  }
  local_100 = this->m_search;
  pacVar12 = this->m_search + 1;
  item = this->m_search + 2;
  local_130._0_4_ = 0.0;
  local_130._4_4_ = 0.0;
  bVar3 = ImGui::Button("Search",(ImVec2 *)local_130);
  if (bVar3) {
    SearchCompound(this,*local_100);
    SearchCompoundNoClear(this,*pacVar12);
    SearchCompoundNoClear(this,*item);
    CenterZoomSearchResults(this);
    ImGui::CloseCurrentPopup();
  }
  ImGui::SameLine(0.0,-1.0);
  local_130._0_4_ = 0.0;
  local_130._4_4_ = 0.0;
  bVar3 = ImGui::Button("Reset",(ImVec2 *)local_130);
  if (bVar3) {
    FindComponent(this,"");
    this->m_search[0][0] = '\0';
    this->m_search[1][0] = '\0';
    this->m_search[2][0] = '\0';
    this->m_active_search_column = 0;
  }
  ImGui::SameLine(0.0,-1.0);
  local_f0._M_dataplus._M_p = (pointer)0x0;
  bVar3 = ImGui::Button("Exit",(ImVec2 *)&local_f0);
  local_d0 = pacVar12;
  local_c8 = item;
  if (bVar3) {
LAB_00115e23:
    FindComponent(this,"");
    this->m_search[0][0] = '\0';
    this->m_search[1][0] = '\0';
    this->m_search[2][0] = '\0';
    this->m_active_search_column = 0;
    ImGui::CloseCurrentPopup();
  }
  else {
    local_130._0_8_ = (long)local_130 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"CloseDialog","");
    bVar3 = KeyBindings::isPressed(&this->keybindings,(string *)local_130);
    if (local_130._0_8_ != (long)local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    if (bVar3) goto LAB_00115e23;
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(-1.0);
  ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");
  ImGui::Separator();
  bVar3 = ImGui::Checkbox("Components",&this->m_searchComponents);
  ImGui::SameLine(0.0,-1.0);
  bVar4 = ImGui::Checkbox("Nets",&this->m_searchNets);
  ImGui::SameLine(0.0,-1.0);
  this_00 = &this->searcher;
  bVar5 = ImGui::Checkbox("Including details",&(this->searcher).m_search_details);
  ImGui::Text(" Search mode: ");
  ImGui::SameLine(0.0,-1.0);
  bVar6 = Searcher::isMode(this_00,Sub);
  bVar6 = ImGui::RadioButton("Substring",bVar6);
  if (bVar6) {
    Searcher::setMode(this_00,Sub);
    local_132 = 1;
  }
  else {
    local_132 = bVar2 | ((bVar3 || bVar4) || bVar5);
  }
  ImGui::SameLine(0.0,-1.0);
  bVar2 = Searcher::isMode(this_00,Prefix);
  bVar2 = ImGui::RadioButton("Prefix",bVar2);
  if (bVar2) {
    Searcher::setMode(this_00,Prefix);
    local_132 = 1;
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(-1.0);
  bVar2 = Searcher::isMode(this_00,Whole);
  bVar2 = ImGui::RadioButton("Whole",bVar2);
  if (bVar2) {
    Searcher::setMode(this_00,Whole);
    local_132 = 1;
  }
  ImGui::PopItemWidth();
  ImGui::Separator();
  ImGui::Columns(3,(char *)0x0,true);
  uVar11 = 0;
  pacVar12 = local_100;
  do {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f0,'\x01');
    local_f8 = uVar11 + 1;
    std::__detail::__to_chars_10_impl<unsigned_int>(local_f0._M_dataplus._M_p,1,(uint)(uVar11 + 1));
    std::operator+(&local_80,"Item #",&local_f0);
    std::operator+(&local_a0,"##search",&local_f0);
    ImGui::Text("%s",local_80._M_dataplus._M_p);
    ImGui::PushItemWidth(-1.0);
    cVar1 = (*pacVar12)[0];
    SearchPartsAndNets((pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                        *)local_130,this,*pacVar12,0x1e);
    bVar2 = true;
    if (((local_130._0_8_ == local_130._8_8_) && (cVar1 != '\0')) &&
       (local_118.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_118.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      ImGui::PushStyleColor(7,0xff6666ff);
      bVar2 = false;
    }
    bVar3 = ImGui::InputText(local_a0._M_dataplus._M_p,*pacVar12,0x80,0x1010,
                             (ImGuiInputTextCallback)0x0,(void *)0x0);
    if (!bVar2) {
      ImGui::PopStyleColor(1);
    }
    bVar2 = ImGui::IsItemActivated();
    uVar10 = (uint)uVar11;
    if (bVar2) {
      this->m_active_search_column = uVar10;
      local_132 = 1;
      uVar8 = uVar10;
    }
    else {
      uVar8 = this->m_active_search_column;
    }
    if ((bVar3) || (((local_132 ^ 1) & 1) == 0 && uVar11 == uVar8)) {
      SearchCompound(this,*pacVar12);
    }
    ImGui::PopItemWidth();
    bVar2 = ImGui::IsItemDeactivated();
    if (!bVar2 && uVar11 == uVar8) {
      bVar2 = ImGui::IsWindowFocused(3);
      if (bVar2) {
        bVar2 = ImGui::IsAnyItemActive();
        if (!bVar2) {
          bVar2 = ImGui::IsMouseClicked(0,false);
          if (!bVar2) {
            ImGui::SetKeyboardFocusHere(-1);
          }
        }
      }
    }
    ImGui::PushItemWidth(-1.0);
    if (cVar1 != '\0') {
      std::operator+(&local_c0,"##SC",&local_f0);
      std::
      pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
      ::pair(&local_60,
             (pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
              *)local_130);
      SearchColumnGenerate(this,&local_c0,&local_60,*pacVar12,0x1e);
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
                (&local_60.second);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
                (&local_60.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    ImGui::PopItemWidth();
    if (uVar10 == 2) {
      ImGui::PopItemWidth();
    }
    else if (uVar10 == 1) {
      iVar7 = DPI(500);
      ImGui::PushItemWidth((float)iVar7);
    }
    ImGui::NextColumn();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&local_118);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pacVar12 = pacVar12 + 1;
    uVar11 = local_f8;
  } while (local_f8 != 3);
  ImGui::PopItemWidth();
  ImGui::Columns(1,(char *)0x0,true);
  ImGui::Separator();
  local_130._0_8_ = (long)local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"Accept","");
  bVar2 = KeyBindings::isPressed(&this->keybindings,(string *)local_130);
  if (local_130._0_8_ != (long)local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if (bVar2) {
    SearchCompound(this,*local_100);
    SearchCompoundNoClear(this,*local_d0);
    SearchCompoundNoClear(this,*local_c8);
    CenterZoomSearchResults(this);
    ImGui::CloseCurrentPopup();
  }
  ImGui::EndPopup();
LAB_00116380:
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void BoardView::SearchComponent(void) {
	bool dummy = true;
	ImGui::SetNextWindowPos(ImVec2(ImGui::GetIO().DisplaySize.x/2, DPI(100)), 0, ImVec2(0.5f, 0.0f));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Search for Component / Network",
	                           &dummy,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings)) {
		//		char cs[128];
		const char *first_button[] = {m_search[0], m_search[1], m_search[2]};

		bool search_params_changed = m_showSearch; //treat initiail popup reopening similar to later search option changes
		if (m_showSearch) {
			m_showSearch       = false;
			//			fprintf(stderr, "Tooltips disabled\n");
		}

		// Column 1, implied.
		//
		//
		if (ImGui::Button("Search")) {
			// FindComponent(first_button);
			SearchCompound(first_button[0]);
			SearchCompoundNoClear(first_button[1]);
			SearchCompoundNoClear(first_button[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // search button

		ImGui::SameLine();
		if (ImGui::Button("Reset")) {
			FindComponent("");
			ResetSearch();
		} // reset button

		ImGui::SameLine();
		if (ImGui::Button("Exit") || keybindings.isPressed("CloseDialog")) {
			FindComponent("");
			ResetSearch();
			ImGui::CloseCurrentPopup();
		} // exit button

		ImGui::SameLine();
		//		ImGui::Dummy(ImVec2(DPI(200), 1));
		//		ImGui::SameLine();
		ImGui::PushItemWidth(-1);
		ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");

		{
			ImGui::Separator();
			search_params_changed |= ImGui::Checkbox("Components", &m_searchComponents);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Nets", &m_searchNets);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Including details", &searcher.configSearchDetails());

			ImGui::Text(" Search mode: ");
			ImGui::SameLine();
			if (ImGui::RadioButton("Substring", searcher.isMode(SearchMode::Sub))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Sub);
			}
			ImGui::SameLine();
			if (ImGui::RadioButton("Prefix", searcher.isMode(SearchMode::Prefix))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Prefix);
			}
			ImGui::SameLine();
			ImGui::PushItemWidth(-1);
			if (ImGui::RadioButton("Whole", searcher.isMode(SearchMode::Whole))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Whole);
			}
			ImGui::PopItemWidth();
		}

		ImGui::Separator();

		ImGui::Columns(3);

		for (int i = 0; i < 3; i++) {
			std::string ui_number   = std::to_string(i + 1); // visual UI number is 1-based unlike 0-based indexing
			std::string title       = "Item #" + ui_number;
			std::string searchLabel = "##search" + ui_number;
			ImGui::Text("%s", title.c_str());

			ImGui::PushItemWidth(-1);

			bool textNonEmpty = m_search[i][0] != '\0';                            // Text typed in the search box
			auto results      = SearchPartsAndNets(m_search[i], 30);               // Perform the search for both nets and parts
			bool hasResults   = !results.first.empty() || !results.second.empty(); // We found some nets or some parts

			if (textNonEmpty && !hasResults) ImGui::PushStyleColor(ImGuiCol_FrameBg, 0xFF6666FF);
			bool textChanged =
			    ImGui::InputText(searchLabel.c_str(),
			                     m_search[i],
			                     128,
			                     ImGuiInputTextFlags_CharsNoBlank | (m_search[0] ? ImGuiInputTextFlags_AutoSelectAll : 0));
			if (textNonEmpty && !hasResults) ImGui::PopStyleColor();
			if (ImGui::IsItemActivated()) {
				// user activates another column
				m_active_search_column = i;
				search_params_changed  = true;
			}

			bool this_column_active = i == m_active_search_column;

			if (textChanged || (search_params_changed && this_column_active)) SearchCompound(m_search[i]);

			ImGui::PopItemWidth();

			if (!ImGui::IsItemDeactivated() && this_column_active &&
			    ImGui::IsWindowFocused(ImGuiFocusedFlags_RootAndChildWindows) && !ImGui::IsAnyItemActive() &&
			    !ImGui::IsMouseClicked(0)) {
				ImGui::SetKeyboardFocusHere(-1);
			} // set keyboard focus back to active colun input-text after other type of element was clicked

			ImGui::PushItemWidth(-1);
			if (textNonEmpty) SearchColumnGenerate("##SC" + ui_number, results, m_search[i], 30);
			ImGui::PopItemWidth();
			if (i == 1)
				ImGui::PushItemWidth(DPI(500));
			else if (i == 2)
				ImGui::PopItemWidth();

			ImGui::NextColumn();
		}

		ImGui::PopItemWidth();

		ImGui::Columns(1); // reset back to single column mode
		ImGui::Separator();

		// Enter and Esc close the search:
		if (keybindings.isPressed("Accept")) {
			// SearchCompound(first_button);
			// SearchCompoundNoClear(first_button2);
			// SearchCompoundNoClear(first_button3);
			SearchCompound(m_search[0]);
			SearchCompoundNoClear(m_search[1]);
			SearchCompoundNoClear(m_search[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // response to keyboard ENTER

		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();
}